

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,JLONG remaining)

{
  JOCTET JVar1;
  undefined4 uVar2;
  byte bVar3;
  jpeg_error_mgr *pjVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  
  lVar10 = (ulong)datalen + remaining;
  if (datalen < 0xe) {
    if ((5 < datalen) && (*data == 'J')) {
LAB_0011e6a8:
      if (((data[1] == 'F') && (data[2] == 'X')) && ((data[3] == 'X' && (data[4] == '\0')))) {
        JVar1 = data[5];
        pjVar4 = cinfo->err;
        if (JVar1 == '\x13') {
          pjVar4->msg_code = 0x6e;
        }
        else if (JVar1 == '\x11') {
          pjVar4->msg_code = 0x6d;
        }
        else {
          if (JVar1 != '\x10') {
            pjVar4->msg_code = 0x59;
            *(uint *)&pjVar4->msg_parm = (uint)data[5];
            (cinfo->err->msg_parm).i[1] = (int)lVar10;
            goto LAB_0011e6d2;
          }
          pjVar4->msg_code = 0x6c;
        }
        goto LAB_0011e6ce;
      }
    }
LAB_0011e6c4:
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x4d;
  }
  else {
    if (*data != 'J') goto LAB_0011e6c4;
    if ((((data[1] != 'F') || (data[2] != 'I')) || (data[3] != 'F')) || (data[4] != '\0'))
    goto LAB_0011e6a8;
    cinfo->saw_JFIF_marker = 1;
    bVar6 = data[5];
    cinfo->JFIF_major_version = bVar6;
    bVar5 = data[6];
    cinfo->JFIF_minor_version = bVar5;
    bVar3 = data[7];
    cinfo->density_unit = bVar3;
    uVar8 = *(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8;
    cinfo->X_density = uVar8;
    uVar9 = *(ushort *)(data + 10) << 8 | *(ushort *)(data + 10) >> 8;
    cinfo->Y_density = uVar9;
    if (bVar6 == 1) {
      uVar7 = 1;
      uVar2 = CONCAT22(uVar9,uVar8);
    }
    else {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x77;
      (pjVar4->msg_parm).i[0] = (uint)bVar6;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      uVar7 = (uint)cinfo->JFIF_major_version;
      bVar5 = cinfo->JFIF_minor_version;
      bVar3 = cinfo->density_unit;
      uVar2._0_2_ = cinfo->X_density;
      uVar2._2_2_ = cinfo->Y_density;
    }
    pjVar4 = cinfo->err;
    (pjVar4->msg_parm).i[0] = uVar7;
    *(uint *)((long)&pjVar4->msg_parm + 4) = (uint)bVar5;
    *(ulong *)((long)&pjVar4->msg_parm + 8) =
         (ulong)(CONCAT24((short)((uint)uVar2 >> 0x10),uVar2) & 0xffff0000ffff);
    *(uint *)((long)&pjVar4->msg_parm + 0x10) = (uint)bVar3;
    pjVar4->msg_code = 0x57;
    (*pjVar4->emit_message)((j_common_ptr)cinfo,1);
    bVar6 = data[0xc];
    bVar5 = data[0xd];
    if (bVar5 != 0 || bVar6 != 0) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x5a;
      *(uint *)&pjVar4->msg_parm = (uint)data[0xc];
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)data[0xd];
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      bVar6 = data[0xc];
      bVar5 = data[0xd];
    }
    lVar10 = lVar10 + -0xe;
    if (lVar10 == (ulong)bVar5 * (ulong)bVar6 * 3) {
      return;
    }
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x58;
  }
LAB_0011e6ce:
  (pjVar4->msg_parm).i[0] = (int)lVar10;
LAB_0011e6d2:
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
examine_app0(j_decompress_ptr cinfo, JOCTET *data, unsigned int datalen,
             JLONG remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  JLONG totallen = (JLONG)datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      data[0] == 0x4A &&
      data[1] == 0x46 &&
      data[2] == 0x49 &&
      data[3] == 0x46 &&
      data[4] == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = data[5];
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = (data[8] << 8) + data[9];
    cinfo->Y_density = (data[10] << 8) + data[11];
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
              cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
             cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
             cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (data[12] | data[13])
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL, data[12], data[13]);
    totallen -= APP0_DATA_LEN;
    if (totallen != ((JLONG)data[12] * (JLONG)data[13] * (JLONG)3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int)totallen);
  } else if (datalen >= 6 &&
             data[0] == 0x4A &&
             data[1] == 0x46 &&
             data[2] == 0x58 &&
             data[3] == 0x58 &&
             data[4] == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (data[5]) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int)totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int)totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int)totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION, data[5], (int)totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int)totallen);
  }
}